

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bp_decoder_ms.c
# Opt level: O2

void bp_update_ms(mod2sparse *H,char *synd,double *log_prob_ratios,int iter,char *decoding)

{
  uint uVar1;
  uint uVar2;
  mod2entry *pmVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  
  uVar2 = H->n_rows;
  uVar1 = H->n_cols;
  dVar7 = exp2(-(double)(iter + 1));
  dVar8 = 1.0 - dVar7;
  uVar4 = 0;
  uVar5 = (ulong)uVar2;
  if ((int)uVar2 < 1) {
    uVar5 = uVar4;
  }
  for (; uVar4 != uVar5; uVar4 = uVar4 + 1) {
    uVar2 = (uint)(synd[uVar4] == '\x01');
    pmVar3 = H->rows + uVar4;
    dVar9 = 1e+308;
    dVar12 = 1e+308;
    while (pmVar3 = pmVar3->right, -1 < pmVar3->row) {
      dVar10 = ABS(pmVar3->pr);
      dVar11 = dVar10;
      if ((dVar12 <= dVar10) && (dVar11 = dVar12, dVar12 = dVar10, dVar9 <= dVar10)) {
        dVar12 = dVar9;
      }
      dVar9 = dVar12;
      uVar2 = (uVar2 + 1) - (uint)(0.0 < pmVar3->pr);
      dVar12 = dVar11;
    }
    pmVar3 = H->rows + uVar4;
    while (pmVar3 = pmVar3->left, -1 < pmVar3->row) {
      uVar6 = -(ulong)(0.0 < pmVar3->pr);
      dVar7 = pow(-1.0,(double)(~uVar6 & (ulong)dVar7 | uVar6 & 0x8000000000000000) +
                       (double)(int)uVar2);
      uVar6 = -(ulong)(ABS(pmVar3->pr) == dVar12);
      pmVar3->lr = (double)(~uVar6 & (ulong)dVar12 | uVar6 & (ulong)dVar9) * dVar7 * dVar8;
    }
  }
  uVar4 = 0;
  uVar5 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar5 = uVar4;
  }
  for (; uVar4 != uVar5; uVar4 = uVar4 + 1) {
    pmVar3 = H->cols + uVar4;
    dVar7 = log_prob_ratio_initial;
    while (pmVar3 = pmVar3->down, -1 < pmVar3->row) {
      dVar7 = dVar7 + pmVar3->lr;
    }
    log_prob_ratios[uVar4] = dVar7;
    decoding[uVar4] = dVar7 <= 0.0;
    pmVar3 = H->cols + uVar4;
    while (pmVar3 = pmVar3->up, -1 < pmVar3->row) {
      pmVar3->pr = dVar7 - pmVar3->lr;
    }
  }
  return;
}

Assistant:

void bp_update_ms(mod2sparse *H,
    char *synd,
    double *log_prob_ratios,
    int iter,
    char *decoding)
    {

  double pr, dR,nX,dX;
  mod2entry *e;
  int N, M;
  int i, j;
  double sgn;
  int mod2row_weight;
  int synd_sgn;
  double min1, min2;
  double alpha;


  M = mod2sparse_rows(H);
  N = mod2sparse_cols(H);

  char *temp_synd;
  char *temp_dec;

  //scaling factor
  iter++;
  alpha=1.0 - pow(2.0,  (-1*(double) iter)/1  );


  //Recompute likelihood ratios.
  for (i = 0; i<M; i++)
  { 
    
    mod2row_weight=0;
    if(synd[i]==0)
      { 
        mod2row_weight=0;
      }
    else if(synd[i]==1)
      { 
        mod2row_weight=1;
      }

    min1=1e308;
    min2=1e308;

    for (e = mod2sparse_first_in_row(H,i);
         !mod2sparse_at_end(e);
         e = mod2sparse_next_in_row(e))
      { 
        if (fabs(e->pr) < min1)
            {
                min2=min1;
                min1=fabs(e->pr);
            }
        else if(fabs(e->pr) < min2)
            {
                min2=fabs(e->pr);
            }
        
        if(e->pr <= 0) mod2row_weight++;
      }

    for (e = mod2sparse_last_in_row(H,i);
         !mod2sparse_at_end(e);
         e = mod2sparse_prev_in_row(e))
      {
        if(e->pr <= 0) sgn=sgn+ mod2row_weight;
        else sgn=mod2row_weight;

        sgn=pow(-1,sgn);
        if (fabs(e->pr)==min1) e->lr=alpha*sgn*min2;
        else e->lr=alpha*sgn*min1;

      }

  }

  //Recompute log-probability-ratios for the bits
  for (j = 0; j<N; j++)
    { 
      pr = log_prob_ratio_initial;
      for (e = mod2sparse_first_in_col(H,j);
          !mod2sparse_at_end(e);
          e = mod2sparse_next_in_col(e))
        {
          pr+=e->lr;
        }
      log_prob_ratios[j]=pr;

      decoding[j] = pr<=0;

      for (e = mod2sparse_last_in_col(H,j);
          !mod2sparse_at_end(e);
          e = mod2sparse_prev_in_col(e))
        {
          e->pr = pr-(e->lr);

        }
    }

}